

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckColumns(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  bool bVar2;
  Bool BVar3;
  ctmbstr ptVar4;
  long lVar5;
  int iVar6;
  ctmbstr cp;
  Node *pNVar7;
  
  piVar1 = &(doc->access).CheckedHeaders;
  *piVar1 = *piVar1 + 1;
  pNVar7 = node->content;
  if (((pNVar7 != (Node *)0x0) && (pNVar7->tag != (Dict *)0x0)) && (pNVar7->tag->id == TidyTag_TH))
  {
    (doc->access).HasTH = yes;
    bVar2 = false;
    iVar6 = 0;
    do {
      if ((pNVar7->tag == (Dict *)0x0) || (pNVar7->tag->id != TidyTag_TH)) {
        bVar2 = true;
      }
      else {
        BVar3 = prvTidynodeIsText(pNVar7->content);
        if (BVar3 != no) {
          ptVar4 = textFromOneNode(doc,pNVar7->content);
          do {
            if (*ptVar4 == '\0') goto LAB_0015335e;
            BVar3 = prvTidyIsWhite((int)*ptVar4);
            ptVar4 = ptVar4 + 1;
          } while (BVar3 != no);
          iVar6 = iVar6 + 1;
        }
      }
LAB_0015335e:
      pNVar7 = pNVar7->next;
    } while (pNVar7 != (Node *)0x0);
    lVar5 = 0x3380;
    if ((!bVar2 && 0 < iVar6) || (lVar5 = 0x3388, 1 < iVar6 && bVar2)) {
      *(undefined4 *)((long)(doc->config).value + lVar5 + -0x78) = 1;
    }
  }
  return;
}

Assistant:

static void CheckColumns( TidyDocImpl* doc, Node* node )
{
    Node* tnode;
    int numTH = 0;
    Bool isMissingHeader = no;

    doc->access.CheckedHeaders++;

    /* Table must have row of headers if headers for columns don't exist */
    if ( nodeIsTH(node->content) )
    {
        doc->access.HasTH = yes;

        for ( tnode = node->content; tnode; tnode = tnode->next )
        {
            if ( nodeIsTH(tnode) )
            {
                if ( TY_(nodeIsText)(tnode->content) )
                {
                    ctmbstr word = textFromOneNode( doc, tnode->content);
                    if ( !IsWhitespace(word) )
                        numTH++;
                }
            }
            else
            {
                isMissingHeader = yes;
            }
        }
    }

    if ( !isMissingHeader && numTH > 0 )
        doc->access.HasValidColumnHeaders = yes;

    if ( isMissingHeader && numTH >= 2 )
        doc->access.HasInvalidColumnHeader = yes;
}